

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::php::Generator::Generate
          (Generator *this,FileDescriptor *file,string *parameter,
          GeneratorContext *generator_context,string *error)

{
  bool is_descriptor_00;
  bool bVar1;
  Syntax SVar2;
  string *__lhs;
  bool is_descriptor;
  string *error_local;
  GeneratorContext *generator_context_local;
  string *parameter_local;
  FileDescriptor *file_local;
  Generator *this_local;
  
  is_descriptor_00 = std::operator==(parameter,"internal");
  if (is_descriptor_00) {
    __lhs = FileDescriptor::name_abi_cxx11_(file);
    bVar1 = std::operator!=(__lhs,&kDescriptorFile_abi_cxx11_);
    if (bVar1) {
      std::__cxx11::string::operator=
                ((string *)error,
                 "Can only generate PHP code for google/protobuf/descriptor.proto.\n");
      return false;
    }
  }
  if ((is_descriptor_00) || (SVar2 = FileDescriptor::syntax(file), SVar2 == SYNTAX_PROTO3)) {
    GenerateFile(file,is_descriptor_00,generator_context);
    this_local._7_1_ = true;
  }
  else {
    std::__cxx11::string::operator=
              ((string *)error,
               "Can only generate PHP code for proto3 .proto files.\nPlease add \'syntax = \"proto3\";\' to the top of your .proto file.\n"
              );
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Generator::Generate(const FileDescriptor* file, const string& parameter,
                         GeneratorContext* generator_context,
                         string* error) const {
  bool is_descriptor = parameter == "internal";

  if (is_descriptor && file->name() != kDescriptorFile) {
    *error =
        "Can only generate PHP code for google/protobuf/descriptor.proto.\n";
    return false;
  }

  if (!is_descriptor && file->syntax() != FileDescriptor::SYNTAX_PROTO3) {
    *error =
        "Can only generate PHP code for proto3 .proto files.\n"
        "Please add 'syntax = \"proto3\";' to the top of your .proto file.\n";
    return false;
  }

  GenerateFile(file, is_descriptor, generator_context);

  return true;
}